

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O0

bool __thiscall MetaCommand::ExportGAD(MetaCommand *this,bool dynamic)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  ulong uVar4;
  ostream *poVar5;
  char *pcVar6;
  reference pOVar7;
  reference pFVar8;
  byte in_SIL;
  long in_RDI;
  size_t slash_1;
  string datapath_1;
  const_iterator itFields_2;
  const_iterator itFields_1;
  bool isData;
  size_t slash;
  string datapath;
  const_iterator itFields;
  const_iterator it;
  uint order;
  ofstream file;
  string filename;
  OptionVector options;
  vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_> *in_stack_fffffffffffff8d8;
  __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
  *in_stack_fffffffffffff8e0;
  ostream *in_stack_fffffffffffff8f0;
  vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *in_stack_fffffffffffff928;
  vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *in_stack_fffffffffffff930;
  undefined8 in_stack_fffffffffffff940;
  MetaCommand *in_stack_fffffffffffff948;
  string *psVar9;
  vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *in_stack_fffffffffffff978;
  vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *in_stack_fffffffffffff980;
  string local_420 [32];
  string local_400 [32];
  long local_3e0;
  string local_3d8 [32];
  Field *local_3b8;
  __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
  local_3b0;
  Option *local_3a8;
  Option *local_3a0;
  Option *local_398;
  string local_390 [32];
  Field *local_370;
  Field *local_368;
  Field *local_360;
  Field *local_358;
  Field *local_350;
  Field *local_348;
  __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
  local_340;
  byte local_331;
  Option *local_330;
  Option *local_328;
  Option *local_320;
  Option *local_318;
  Option *local_310;
  Option *local_308;
  Option *local_300;
  string local_2f8 [32];
  string local_2d8 [32];
  long local_2b8;
  string local_2b0 [32];
  Field *local_290;
  __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
  local_288;
  Option *local_280;
  Option *local_278;
  __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
  local_270;
  uint local_264;
  ostream local_260 [512];
  string local_60 [32];
  undefined4 local_40;
  byte local_11;
  byte local_1;
  
  local_11 = in_SIL & 1;
  std::operator<<((ostream *)&std::cout,"Exporting GAD file...");
  std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::vector
            (in_stack_fffffffffffff930,in_stack_fffffffffffff928);
  if ((local_11 & 1) != 0) {
    std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::operator=
              (in_stack_fffffffffffff980,in_stack_fffffffffffff978);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::string::string(local_60,(string *)(in_RDI + 0x40));
    std::__cxx11::string::operator+=(local_60,".gad.xml");
    std::ofstream::ofstream(local_260);
    _Var3 = std::__cxx11::string::c_str();
    std::operator|(_S_bin,_S_out);
    std::ofstream::open((char *)local_260,_Var3);
    bVar1 = std::ofstream::is_open();
    if ((bVar1 & 1) == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Cannot open file for writing: ");
      pcVar6 = (char *)std::__cxx11::string::c_str();
      poVar5 = std::operator<<(poVar5,pcVar6);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      local_1 = 0;
    }
    else {
      poVar5 = std::operator<<(local_260,"<?xml version=\"1.0\" encoding=\"UTF-8\" ?>");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(local_260,"<gridApplication");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(local_260,"xmlns:xsi=\"http://www.w3.org/2001/XMLSchema-instance\"");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(local_260,
                               "xsi:noNamespaceSchemaLocation=\"grid-application-description.xsd\"")
      ;
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(local_260,"name=\"");
      pcVar6 = (char *)std::__cxx11::string::c_str();
      poVar5 = std::operator<<(poVar5,pcVar6);
      poVar5 = std::operator<<(poVar5,"\"");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(local_260,"description=\"");
      pcVar6 = (char *)std::__cxx11::string::c_str();
      poVar5 = std::operator<<(poVar5,pcVar6);
      poVar5 = std::operator<<(poVar5,"\">");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(local_260,
                               "<applicationComponent name=\"Client\" remoteExecution=\"true\">");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(local_260,"<componentActionList>");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(local_260,std::endl<char,std::char_traits<char>>);
      local_264 = 1;
      local_278 = (Option *)
                  std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::begin
                            ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                             in_stack_fffffffffffff8d8);
      __gnu_cxx::
      __normal_iterator<MetaCommand::Option_const*,std::vector<MetaCommand::Option,std::allocator<MetaCommand::Option>>>
      ::__normal_iterator<MetaCommand::Option*>
                ((__normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                  *)in_stack_fffffffffffff8e0,
                 (__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                  *)in_stack_fffffffffffff8d8);
      while( true ) {
        local_280 = (Option *)
                    std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::end
                              ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                               in_stack_fffffffffffff8d8);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                            *)in_stack_fffffffffffff8e0,
                           (__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                            *)in_stack_fffffffffffff8d8);
        if (!bVar2) break;
        __gnu_cxx::
        __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
        ::operator*(&local_270);
        local_288._M_current =
             (Field *)std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::begin
                                (in_stack_fffffffffffff8d8);
        while( true ) {
          __gnu_cxx::
          __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
          ::operator*(&local_270);
          local_290 = (Field *)std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>
                               ::end(in_stack_fffffffffffff8d8);
          bVar2 = __gnu_cxx::operator!=
                            (in_stack_fffffffffffff8e0,
                             (__normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                              *)in_stack_fffffffffffff8d8);
          if (!bVar2) break;
          pFVar8 = __gnu_cxx::
                   __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                   ::operator*(&local_288);
          if (pFVar8->externaldata == DATA_IN) {
            poVar5 = std::operator<<(local_260," <componentAction type=\"DataRelocation\" order=\"")
            ;
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_264);
            poVar5 = std::operator<<(poVar5,"\">");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            poVar5 = std::operator<<(local_260,"  <parameter name=\"Name\" value=\"");
            pFVar8 = __gnu_cxx::
                     __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                     ::operator*(&local_288);
            poVar5 = std::operator<<(poVar5,(string *)pFVar8);
            poVar5 = std::operator<<(poVar5,"\"/>");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            poVar5 = std::operator<<(local_260,"  <parameter name=\"Host\" value=\"hostname\"/>");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            poVar5 = std::operator<<(local_260,"  <parameter name=\"Description\" value=\"");
            pFVar8 = __gnu_cxx::
                     __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                     ::operator*(&local_288);
            poVar5 = std::operator<<(poVar5,(string *)&pFVar8->description);
            poVar5 = std::operator<<(poVar5,"\"/>");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            poVar5 = std::operator<<(local_260,"  <parameter name=\"Direction\" value=\"In\"/>");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            poVar5 = std::operator<<(local_260,"  <parameter name=\"Protocol\" value=\"gsiftp\"/>");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            poVar5 = std::operator<<(local_260,"  <parameter name=\"SourceDataPath\" value=\"");
            pFVar8 = __gnu_cxx::
                     __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                     ::operator*(&local_288);
            poVar5 = std::operator<<(poVar5,(string *)&pFVar8->value);
            poVar5 = std::operator<<(poVar5,"\"/>");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            pFVar8 = __gnu_cxx::
                     __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                     ::operator*(&local_288);
            std::__cxx11::string::string(local_2b0,(string *)&pFVar8->value);
            local_2b8 = std::__cxx11::string::find_last_of((char *)local_2b0,0x1d8c59);
            if (local_2b8 != 0) {
              std::__cxx11::string::size();
              std::__cxx11::string::substr((ulong)local_2d8,(ulong)local_2b0);
              std::__cxx11::string::operator=(local_2b0,local_2d8);
              std::__cxx11::string::~string(local_2d8);
            }
            local_2b8 = std::__cxx11::string::find_last_of((char *)local_2b0,0x1e6d5f);
            if (local_2b8 != 0) {
              std::__cxx11::string::size();
              std::__cxx11::string::substr((ulong)local_2f8,(ulong)local_2b0);
              std::__cxx11::string::operator=(local_2b0,local_2f8);
              std::__cxx11::string::~string(local_2f8);
            }
            poVar5 = std::operator<<(local_260,"  <parameter name=\"DestDataPath\" value=\"");
            pcVar6 = (char *)std::__cxx11::string::c_str();
            poVar5 = std::operator<<(poVar5,pcVar6);
            poVar5 = std::operator<<(poVar5,"\"/>");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            poVar5 = std::operator<<(local_260," </componentAction>");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            std::ostream::operator<<(local_260,std::endl<char,std::char_traits<char>>);
            local_264 = local_264 + 1;
            std::__cxx11::string::~string(local_2b0);
          }
          __gnu_cxx::
          __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
          ::operator++(&local_288);
        }
        __gnu_cxx::
        __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
        ::operator++(&local_270);
      }
      poVar5 = std::operator<<(local_260," <componentAction type=\"JobSubmission\" order=\"");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_264);
      poVar5 = std::operator<<(poVar5,"\">");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(local_260,"  <parameter name=\"Executable\" value=\"");
      pcVar6 = (char *)std::__cxx11::string::c_str();
      poVar5 = std::operator<<(poVar5,pcVar6);
      poVar5 = std::operator<<(poVar5,"\"/>");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::operator<<(local_260,"  <parameter name=\"Arguments\"  value=\"");
      local_308 = (Option *)
                  std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::begin
                            ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                             in_stack_fffffffffffff8d8);
      __gnu_cxx::
      __normal_iterator<MetaCommand::Option_const*,std::vector<MetaCommand::Option,std::allocator<MetaCommand::Option>>>
      ::__normal_iterator<MetaCommand::Option*>
                ((__normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                  *)in_stack_fffffffffffff8e0,
                 (__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                  *)in_stack_fffffffffffff8d8);
      local_270._M_current = local_300;
      while( true ) {
        local_310 = (Option *)
                    std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::end
                              ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                               in_stack_fffffffffffff8d8);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                            *)in_stack_fffffffffffff8e0,
                           (__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                            *)in_stack_fffffffffffff8d8);
        if (!bVar2) break;
        local_318 = (Option *)
                    std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::begin
                              ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                               in_stack_fffffffffffff8d8);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                            *)in_stack_fffffffffffff8e0,
                           (__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                            *)in_stack_fffffffffffff8d8);
        if (bVar2) {
          std::operator<<(local_260," ");
        }
        poVar5 = std::operator<<(local_260,"{");
        __gnu_cxx::
        __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
        ::operator*(&local_270);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        poVar5 = std::operator<<(poVar5,pcVar6);
        std::operator<<(poVar5,"}");
        __gnu_cxx::
        __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
        ::operator++(&local_270);
      }
      poVar5 = std::operator<<(local_260,"\"/>");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      local_328 = (Option *)
                  std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::begin
                            ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                             in_stack_fffffffffffff8d8);
      __gnu_cxx::
      __normal_iterator<MetaCommand::Option_const*,std::vector<MetaCommand::Option,std::allocator<MetaCommand::Option>>>
      ::__normal_iterator<MetaCommand::Option*>
                ((__normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                  *)in_stack_fffffffffffff8e0,
                 (__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                  *)in_stack_fffffffffffff8d8);
      local_270._M_current = local_320;
      while( true ) {
        local_330 = (Option *)
                    std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::end
                              ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                               in_stack_fffffffffffff8d8);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                            *)in_stack_fffffffffffff8e0,
                           (__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                            *)in_stack_fffffffffffff8d8);
        if (!bVar2) break;
        local_331 = 0;
        __gnu_cxx::
        __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
        ::operator*(&local_270);
        local_340._M_current =
             (Field *)std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::begin
                                (in_stack_fffffffffffff8d8);
        while( true ) {
          __gnu_cxx::
          __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
          ::operator*(&local_270);
          local_348 = (Field *)std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>
                               ::end(in_stack_fffffffffffff8d8);
          bVar2 = __gnu_cxx::operator!=
                            (in_stack_fffffffffffff8e0,
                             (__normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                              *)in_stack_fffffffffffff8d8);
          if (!bVar2) break;
          pFVar8 = __gnu_cxx::
                   __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                   ::operator*(&local_340);
          if (pFVar8->externaldata != DATA_NONE) {
            local_331 = 1;
            break;
          }
          __gnu_cxx::
          __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
          ::operator++(&local_340);
        }
        if ((local_331 & 1) == 0) {
          poVar5 = std::operator<<(local_260,"   <group name=\"");
          __gnu_cxx::
          __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
          ::operator*(&local_270);
          pcVar6 = (char *)std::__cxx11::string::c_str();
          std::operator<<(poVar5,pcVar6);
          std::operator<<(local_260,"\" syntax=\"");
          __gnu_cxx::
          __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
          ::operator*(&local_270);
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            poVar5 = std::operator<<(local_260,"-");
            __gnu_cxx::
            __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
            ::operator*(&local_270);
            pcVar6 = (char *)std::__cxx11::string::c_str();
            poVar5 = std::operator<<(poVar5,pcVar6);
            std::operator<<(poVar5," ");
          }
          __gnu_cxx::
          __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
          ::operator*(&local_270);
          local_350 = (Field *)std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>
                               ::begin(in_stack_fffffffffffff8d8);
          local_340._M_current = local_350;
          while( true ) {
            __gnu_cxx::
            __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
            ::operator*(&local_270);
            local_358 = (Field *)std::
                                 vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::
                                 end(in_stack_fffffffffffff8d8);
            bVar2 = __gnu_cxx::operator!=
                              (in_stack_fffffffffffff8e0,
                               (__normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                                *)in_stack_fffffffffffff8d8);
            if (!bVar2) break;
            __gnu_cxx::
            __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
            ::operator*(&local_270);
            local_360 = (Field *)std::
                                 vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::
                                 begin(in_stack_fffffffffffff8d8);
            bVar2 = __gnu_cxx::operator!=
                              (in_stack_fffffffffffff8e0,
                               (__normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                                *)in_stack_fffffffffffff8d8);
            if (bVar2) {
              std::operator<<(local_260," ");
            }
            poVar5 = std::operator<<(local_260,"{");
            pOVar7 = __gnu_cxx::
                     __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                     ::operator*(&local_270);
            poVar5 = std::operator<<(poVar5,(string *)pOVar7);
            pFVar8 = __gnu_cxx::
                     __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                     ::operator*(&local_340);
            poVar5 = std::operator<<(poVar5,(string *)pFVar8);
            std::operator<<(poVar5,"}");
            __gnu_cxx::
            __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
            ::operator++(&local_340);
          }
          std::operator<<(local_260,"\"");
          pOVar7 = __gnu_cxx::
                   __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                   ::operator*(&local_270);
          if ((pOVar7->required & 1U) == 0) {
            std::operator<<(local_260," optional=\"true\"");
            pOVar7 = __gnu_cxx::
                     __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                     ::operator*(&local_270);
            if ((pOVar7->userDefined & 1U) == 0) {
              std::operator<<(local_260," selected=\"false\"");
            }
            else {
              std::operator<<(local_260," selected=\"true\"");
            }
          }
          poVar5 = std::operator<<(local_260,">");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          __gnu_cxx::
          __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
          ::operator*(&local_270);
          local_368 = (Field *)std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>
                               ::begin(in_stack_fffffffffffff8d8);
          local_340._M_current = local_368;
          while( true ) {
            __gnu_cxx::
            __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
            ::operator*(&local_270);
            local_370 = (Field *)std::
                                 vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::
                                 end(in_stack_fffffffffffff8d8);
            bVar2 = __gnu_cxx::operator!=
                              (in_stack_fffffffffffff8e0,
                               (__normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                                *)in_stack_fffffffffffff8d8);
            if (!bVar2) break;
            poVar5 = std::operator<<(local_260,"    <argument name=\"");
            pOVar7 = __gnu_cxx::
                     __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                     ::operator*(&local_270);
            poVar5 = std::operator<<(poVar5,(string *)pOVar7);
            pFVar8 = __gnu_cxx::
                     __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                     ::operator*(&local_340);
            std::operator<<(poVar5,(string *)pFVar8);
            poVar5 = std::operator<<(local_260,"\" value=\"");
            pFVar8 = __gnu_cxx::
                     __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                     ::operator*(&local_340);
            std::operator<<(poVar5,(string *)&pFVar8->value);
            poVar5 = std::operator<<(local_260,"\" type=\"");
            __gnu_cxx::
            __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
            ::operator*(&local_340);
            TypeToString_abi_cxx11_
                      (in_stack_fffffffffffff948,
                       (TypeEnumType)((ulong)in_stack_fffffffffffff940 >> 0x20));
            pcVar6 = (char *)std::__cxx11::string::c_str();
            std::operator<<(poVar5,pcVar6);
            std::__cxx11::string::~string(local_390);
            std::operator<<(local_260,"\"");
            __gnu_cxx::
            __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
            ::operator*(&local_340);
            uVar4 = std::__cxx11::string::empty();
            if ((uVar4 & 1) == 0) {
              poVar5 = std::operator<<(local_260," rangeMin=\"");
              pFVar8 = __gnu_cxx::
                       __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                       ::operator*(&local_340);
              poVar5 = std::operator<<(poVar5,(string *)&pFVar8->rangeMin);
              std::operator<<(poVar5,"\"");
            }
            __gnu_cxx::
            __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
            ::operator*(&local_340);
            uVar4 = std::__cxx11::string::empty();
            if ((uVar4 & 1) == 0) {
              poVar5 = std::operator<<(local_260," rangeMax=\"");
              pFVar8 = __gnu_cxx::
                       __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                       ::operator*(&local_340);
              poVar5 = std::operator<<(poVar5,(string *)&pFVar8->rangeMax);
              std::operator<<(poVar5,"\"");
            }
            poVar5 = std::operator<<(local_260,"/>");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            __gnu_cxx::
            __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
            ::operator++(&local_340);
          }
          poVar5 = std::operator<<(local_260,"  </group>");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          __gnu_cxx::
          __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
          ::operator++(&local_270);
        }
        else {
          __gnu_cxx::
          __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
          ::operator++(&local_270);
        }
      }
      poVar5 = std::operator<<(local_260," </componentAction>");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      local_264 = local_264 + 1;
      std::ostream::operator<<(local_260,std::endl<char,std::char_traits<char>>);
      local_3a0 = (Option *)
                  std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::begin
                            ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                             in_stack_fffffffffffff8d8);
      __gnu_cxx::
      __normal_iterator<MetaCommand::Option_const*,std::vector<MetaCommand::Option,std::allocator<MetaCommand::Option>>>
      ::__normal_iterator<MetaCommand::Option*>
                ((__normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                  *)in_stack_fffffffffffff8e0,
                 (__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                  *)in_stack_fffffffffffff8d8);
      local_270._M_current = local_398;
      while( true ) {
        local_3a8 = (Option *)
                    std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::end
                              ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                               in_stack_fffffffffffff8d8);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                            *)in_stack_fffffffffffff8e0,
                           (__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                            *)in_stack_fffffffffffff8d8);
        if (!bVar2) break;
        __gnu_cxx::
        __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
        ::operator*(&local_270);
        local_3b0._M_current =
             (Field *)std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::begin
                                (in_stack_fffffffffffff8d8);
        while( true ) {
          __gnu_cxx::
          __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
          ::operator*(&local_270);
          local_3b8 = (Field *)std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>
                               ::end(in_stack_fffffffffffff8d8);
          bVar2 = __gnu_cxx::operator!=
                            (in_stack_fffffffffffff8e0,
                             (__normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                              *)in_stack_fffffffffffff8d8);
          if (!bVar2) break;
          pFVar8 = __gnu_cxx::
                   __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                   ::operator*(&local_3b0);
          if (pFVar8->externaldata == DATA_OUT) {
            poVar5 = std::operator<<(local_260," <componentAction type=\"DataRelocation\" order=\"")
            ;
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_264);
            poVar5 = std::operator<<(poVar5,"\">");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            poVar5 = std::operator<<(local_260,"  <parameter name=\"Name\" Value=\"");
            pFVar8 = __gnu_cxx::
                     __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                     ::operator*(&local_3b0);
            poVar5 = std::operator<<(poVar5,(string *)pFVar8);
            poVar5 = std::operator<<(poVar5,"\"/>");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            poVar5 = std::operator<<(local_260,"  <parameter name=\"Host\" Value=\"hostname\"/>");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            poVar5 = std::operator<<(local_260,"  <parameter name=\"Description\" value=\"");
            pFVar8 = __gnu_cxx::
                     __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                     ::operator*(&local_3b0);
            poVar5 = std::operator<<(poVar5,(string *)&pFVar8->description);
            poVar5 = std::operator<<(poVar5,"\"/>");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            poVar5 = std::operator<<(local_260,"  <parameter name=\"Direction\" value=\"Out\"/>");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            poVar5 = std::operator<<(local_260,"  <parameter name=\"Protocol\" value=\"gsiftp\"/>");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            pFVar8 = __gnu_cxx::
                     __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                     ::operator*(&local_3b0);
            std::__cxx11::string::string(local_3d8,(string *)&pFVar8->value);
            local_3e0 = std::__cxx11::string::find_last_of((char *)local_3d8,0x1d8c59);
            if (local_3e0 != 0) {
              psVar9 = local_3d8;
              std::__cxx11::string::size();
              std::__cxx11::string::substr((ulong)local_400,(ulong)psVar9);
              std::__cxx11::string::operator=(local_3d8,local_400);
              std::__cxx11::string::~string(local_400);
            }
            local_3e0 = std::__cxx11::string::find_last_of((char *)local_3d8,0x1e6d5f);
            if (local_3e0 != 0) {
              std::__cxx11::string::size();
              std::__cxx11::string::substr((ulong)local_420,(ulong)local_3d8);
              std::__cxx11::string::operator=(local_3d8,local_420);
              std::__cxx11::string::~string(local_420);
            }
            poVar5 = std::operator<<(local_260,"  <parameter name=\"SourceDataPath\" value=\"");
            pcVar6 = (char *)std::__cxx11::string::c_str();
            poVar5 = std::operator<<(poVar5,pcVar6);
            poVar5 = std::operator<<(poVar5,"\"/>");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            poVar5 = std::operator<<(local_260,"  <parameter name=\"DestDataPath\" value=\"");
            pFVar8 = __gnu_cxx::
                     __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                     ::operator*(&local_3b0);
            poVar5 = std::operator<<(poVar5,(string *)&pFVar8->value);
            poVar5 = std::operator<<(poVar5,"\"/>");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            poVar5 = std::operator<<(local_260," </componentAction>");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            std::ostream::operator<<(local_260,std::endl<char,std::char_traits<char>>);
            local_264 = local_264 + 1;
            std::__cxx11::string::~string(local_3d8);
          }
          __gnu_cxx::
          __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
          ::operator++(&local_3b0);
        }
        __gnu_cxx::
        __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
        ::operator++(&local_270);
      }
      poVar5 = std::operator<<(local_260,"    </componentActionList>");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      in_stack_fffffffffffff8f0 = std::operator<<(local_260,"  </applicationComponent>");
      std::ostream::operator<<(in_stack_fffffffffffff8f0,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(local_260,"</gridApplication>");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::ofstream::close();
      poVar5 = std::operator<<((ostream *)&std::cout,"done");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      local_1 = 1;
    }
    local_40 = 1;
    std::ofstream::~ofstream(local_260);
    std::__cxx11::string::~string(local_60);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"Set the name of the application using SetName()"
                            );
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_1 = 0;
    local_40 = 1;
  }
  std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::~vector
            ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
             in_stack_fffffffffffff8f0);
  return (bool)(local_1 & 1);
}

Assistant:

bool MetaCommand::ExportGAD(bool dynamic)
{
  METAIO_STREAM::cout << "Exporting GAD file...";

  OptionVector options = m_OptionVector;
  if(dynamic)
    {
    options = m_ParsedOptionVector;
    }

    if (m_Name.empty()) {
      METAIO_STREAM::cout << "Set the name of the application using SetName()"
                          << METAIO_STREAM::endl;
      return false;
    }

  METAIO_STL::string filename = m_Name;
  filename += ".gad.xml";

  METAIO_STREAM::ofstream file;
  file.open(filename.c_str(), METAIO_STREAM::ios::binary | METAIO_STREAM::ios::out);
  if(!file.is_open())
    {
    METAIO_STREAM::cout << "Cannot open file for writing: " << filename.c_str() <<  METAIO_STREAM::endl;
    return false;
    }

    file << R"(<?xml version="1.0" encoding="UTF-8" ?>)" << METAIO_STREAM::endl;
    file << "<gridApplication" << METAIO_STREAM::endl;
    file << "xmlns:xsi=\"http://www.w3.org/2001/XMLSchema-instance\""
         << METAIO_STREAM::endl;
    file << "xsi:noNamespaceSchemaLocation=\"grid-application-description.xsd\""
         << METAIO_STREAM::endl;
    file << "name=\"" << m_Name.c_str() << "\"" << METAIO_STREAM::endl;
    file << "description=\"" << m_Description.c_str() << "\">"
         << METAIO_STREAM::endl;
    file << R"(<applicationComponent name="Client" remoteExecution="true">)"
         << METAIO_STREAM::endl;
    file << "<componentActionList>" << METAIO_STREAM::endl;
    file << METAIO_STREAM::endl;

    unsigned int order = 1;
    // Write out the input data to be transfered
    OptionVector::const_iterator it = options.begin();
    while (it != options.end()) {
      auto itFields = (*it).fields.begin();
      while (itFields != (*it).fields.end()) {
        if ((*itFields).externaldata == DATA_IN) {
          file << R"( <componentAction type="DataRelocation" order=")" << order
               << "\">" << METAIO_STREAM::endl;
          file << R"(  <parameter name="Name" value=")" << (*itFields).name
               << "\"/>" << METAIO_STREAM::endl;
          file << R"(  <parameter name="Host" value="hostname"/>)"
               << METAIO_STREAM::endl;
          file << R"(  <parameter name="Description" value=")"
               << (*itFields).description << "\"/>" << METAIO_STREAM::endl;
          file << R"(  <parameter name="Direction" value="In"/>)"
               << METAIO_STREAM::endl;
          file << R"(  <parameter name="Protocol" value="gsiftp"/>)"
               << METAIO_STREAM::endl;
          file << R"(  <parameter name="SourceDataPath" value=")"
               << (*itFields).value << "\"/>" << METAIO_STREAM::endl;

          METAIO_STL::string datapath = (*itFields).value;
          size_t slash = datapath.find_last_of("/");
          if (slash > 0) {
            datapath = datapath.substr(slash + 1, datapath.size() - slash - 1);
          }
        slash = datapath.find_last_of("\\");
        if(slash>0)
          {
          datapath = datapath.substr(slash+1,datapath.size()-slash-1);
          }
          file << R"(  <parameter name="DestDataPath" value=")"
               << datapath.c_str() << "\"/>" << METAIO_STREAM::endl;
          file << " </componentAction>" << METAIO_STREAM::endl;
          file << METAIO_STREAM::endl;
          ++order;
        }
      ++itFields;
      }
    ++it;
    }

    file << R"( <componentAction type="JobSubmission" order=")" << order
         << "\">" << METAIO_STREAM::endl;
    file << R"(  <parameter name="Executable" value=")"
         << m_ExecutableName.c_str() << "\"/>" << METAIO_STREAM::endl;
    file << R"(  <parameter name="Arguments"  value=")";
    // Write out the command line arguments
    it = options.begin();
    while (it != options.end()) {
      if (it != options.begin()) {
        file << " ";
      }
    file << "{" << (*it).name.c_str() << "}";
    ++it;
    }
  file << "\"/>" << METAIO_STREAM::endl;
  // Write out the arguments that are not data
  it = options.begin();
  while(it != options.end())
    {
    // Find if this is a non data field
    bool isData = false;
    auto itFields = (*it).fields.begin();
    while(itFields != (*it).fields.end())
      {
      if((*itFields).externaldata != DATA_NONE)
        {
        isData = true;
        break;
        }
      ++itFields;
      }

    if(isData)
      {
      ++it;
      continue;
      }

    file << "   <group name=\"" << (*it).name.c_str();
    file << "\" syntax=\"";

    if (!(*it).tag.empty()) {
      file << "-" << (*it).tag.c_str() << " ";
    }

    itFields = (*it).fields.begin();
    while(itFields != (*it).fields.end())
      {
      if(itFields != (*it).fields.begin())
        {
        file << " ";
        }
      file << "{" << (*it).name << (*itFields).name << "}";
      ++itFields;
      }
    file << "\"";

    if(!(*it).required)
      {
      file << " optional=\"true\"";

      // Add if the option was selected
      if((*it).userDefined)
        {
        file << " selected=\"true\"";
        }
      else
        {
        file << " selected=\"false\"";
        }
      }

    file << ">" << METAIO_STREAM::endl;

    // Now writes the value of the arguments
    itFields = (*it).fields.begin();
    while(itFields != (*it).fields.end())
      {
      file << "    <argument name=\"" << (*it).name << (*itFields).name;
      file << "\" value=\"" << (*itFields).value;
      file << "\" type=\"" << this->TypeToString((*itFields).type).c_str();
      file << "\"";

      if (!(*itFields).rangeMin.empty()) {
        file << " rangeMin=\"" << (*itFields).rangeMin << "\"";
      }

      if (!(*itFields).rangeMax.empty()) {
        file << " rangeMax=\"" << (*itFields).rangeMax << "\"";
      }
      file << "/>" << METAIO_STREAM::endl;
      ++itFields;
      }
    file << "  </group>" << METAIO_STREAM::endl;
    ++it;
    }
  file << " </componentAction>" << METAIO_STREAM::endl;
  ++order;
  file << METAIO_STREAM::endl;
  // Write out the input data to be transfered
  it = options.begin();
  while(it != options.end())
    {
    auto itFields = (*it).fields.begin();
    while(itFields != (*it).fields.end())
      {
      if((*itFields).externaldata == DATA_OUT)
        {
        file << R"( <componentAction type="DataRelocation" order=")" << order
             << "\">" << METAIO_STREAM::endl;
        file << R"(  <parameter name="Name" Value=")" << (*itFields).name
             << "\"/>" << METAIO_STREAM::endl;
        file << R"(  <parameter name="Host" Value="hostname"/>)"
             << METAIO_STREAM::endl;
        file << R"(  <parameter name="Description" value=")"
             << (*itFields).description << "\"/>" << METAIO_STREAM::endl;
        file << R"(  <parameter name="Direction" value="Out"/>)"
             << METAIO_STREAM::endl;
        file << R"(  <parameter name="Protocol" value="gsiftp"/>)"
             << METAIO_STREAM::endl;
        METAIO_STL::string datapath = (*itFields).value;
        size_t slash = datapath.find_last_of("/");
        if(slash>0)
          {
          datapath = datapath.substr(slash+1,datapath.size()-slash-1);
          }
        slash = datapath.find_last_of("\\");
        if(slash>0)
          {
          datapath = datapath.substr(slash+1,datapath.size()-slash-1);
          }
          file << R"(  <parameter name="SourceDataPath" value=")"
               << datapath.c_str() << "\"/>" << METAIO_STREAM::endl;
          file << R"(  <parameter name="DestDataPath" value=")"
               << (*itFields).value << "\"/>" << METAIO_STREAM::endl;
          file << " </componentAction>" << METAIO_STREAM::endl;
          file << METAIO_STREAM::endl;
          ++order;
        }
      ++itFields;
      }
    ++it;
    }
  file << "    </componentActionList>" << METAIO_STREAM::endl;
  file << "  </applicationComponent>" << METAIO_STREAM::endl;
  file << "</gridApplication>" << METAIO_STREAM::endl;

  file.close();

  METAIO_STREAM::cout << "done" << METAIO_STREAM::endl;
  return true;
}